

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::GetMessageByteSizeLong(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  string *psVar2;
  size_t sVar3;
  anon_enum_32 local_1c;
  anon_enum_32 local_18 [4];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x206,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_18,(char (*) [12])"not present");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  local_18[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
  local_1c = OPTIONAL_FIELD;
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                     (local_18,&local_1c,
                      "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                     );
  if (psVar2 == (string *)0x0) {
    local_18[0] = anon_unknown_58::cpp_type(pEVar1->type);
    local_1c = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_18,&local_1c,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 == (string *)0x0) {
      if ((pEVar1->field_0xa & 4) == 0) {
        sVar3 = (**(code **)(*(long *)pEVar1->field_0 + 0x18))();
      }
      else {
        sVar3 = (**(code **)(*(long *)pEVar1->field_0 + 0x68))();
      }
      return sVar3;
    }
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x207,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

size_t ExtensionSet::GetMessageByteSizeLong(int number) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
  return extension->is_lazy ? extension->ptr.lazymessage_value->ByteSizeLong()
                            : extension->ptr.message_value->ByteSizeLong();
}